

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateQueryUtil.cpp
# Opt level: O0

void deqp::gls::StateQueryUtil::verifyIntegerVec4
               (ResultCollector *result,QueriedState *state,IVec4 *expected)

{
  int iVar1;
  DataType DVar2;
  GLIntVec4 *paGVar3;
  int *piVar4;
  ostream *poVar5;
  ArrayPointer<int> AVar6;
  string local_1e8;
  int *local_1c8;
  int local_1c0;
  ArrayPointer<int> local_1b8 [2];
  ostringstream local_198 [8];
  ostringstream buf;
  IVec4 *expected_local;
  QueriedState *state_local;
  ResultCollector *result_local;
  
  DVar2 = QueriedState::getType(state);
  if (DVar2 == DATATYPE_INTEGER_VEC4) {
    paGVar3 = QueriedState::getIntVec4Access(state);
    iVar1 = (*paGVar3)[0];
    piVar4 = tcu::Vector<int,_4>::operator[](expected,0);
    if (iVar1 == *piVar4) {
      paGVar3 = QueriedState::getIntVec4Access(state);
      iVar1 = (*paGVar3)[1];
      piVar4 = tcu::Vector<int,_4>::operator[](expected,1);
      if (iVar1 == *piVar4) {
        paGVar3 = QueriedState::getIntVec4Access(state);
        iVar1 = (*paGVar3)[2];
        piVar4 = tcu::Vector<int,_4>::operator[](expected,2);
        if (iVar1 == *piVar4) {
          paGVar3 = QueriedState::getIntVec4Access(state);
          iVar1 = (*paGVar3)[3];
          piVar4 = tcu::Vector<int,_4>::operator[](expected,3);
          if (iVar1 == *piVar4) {
            return;
          }
        }
      }
    }
    std::__cxx11::ostringstream::ostringstream(local_198);
    poVar5 = std::operator<<((ostream *)local_198,"Expected ");
    poVar5 = tcu::operator<<(poVar5,expected);
    poVar5 = std::operator<<(poVar5,", got ");
    paGVar3 = QueriedState::getIntVec4Access(state);
    AVar6 = tcu::formatArray<int,4>((int (*) [4])paGVar3);
    local_1c8 = AVar6.arr;
    local_1c0 = AVar6.size;
    local_1b8[0].arr = local_1c8;
    local_1b8[0].size = local_1c0;
    tcu::Format::operator<<(poVar5,local_1b8);
    std::__cxx11::ostringstream::str();
    tcu::ResultCollector::fail(result,&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return;
}

Assistant:

void verifyIntegerVec4 (tcu::ResultCollector& result, QueriedState& state, const tcu::IVec4& expected)
{
	switch (state.getType())
	{
		case DATATYPE_INTEGER_VEC4:
		{
			if (state.getIntVec4Access()[0] != expected[0] ||
				state.getIntVec4Access()[1] != expected[1] ||
				state.getIntVec4Access()[2] != expected[2] ||
				state.getIntVec4Access()[3] != expected[3])
			{
				std::ostringstream buf;
				buf << "Expected " << expected << ", got " << tcu::formatArray(state.getIntVec4Access());
				result.fail(buf.str());
			}
			break;
		}

		default:
			DE_ASSERT(DE_FALSE);
			break;
	}
}